

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::PointLight::SampleLe
          (LightLeSample *__return_storage_ptr__,PointLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  Float a;
  undefined8 uVar1;
  uintptr_t uVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Point3<float> PVar12;
  Vector3f VVar13;
  SampledSpectrum SVar14;
  SampledSpectrum local_38;
  undefined1 auVar11 [56];
  
  auVar11 = in_ZMM1._8_56_;
  auVar8 = in_register_00001204._4_56_;
  local_38.values.values[3] = local_38.values.values[1];
  local_38.values.values._0_12_ = ZEXT812(0);
  PVar12 = Transform::operator()
                     (&(this->super_LightBase).renderFromLight,(Point3<float> *)&local_38);
  auVar4._0_8_ = PVar12.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar8;
  VVar13 = SampleUniformSphere(u1);
  auVar5._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar8;
  a = this->scale;
  auVar8 = (undefined1  [56])0x0;
  uVar2 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  SVar14 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar9._0_8_ = SVar14.values.values._8_8_;
  auVar9._8_56_ = auVar11;
  auVar6._0_8_ = SVar14.values.values._0_8_;
  auVar6._8_56_ = auVar8;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar9._0_16_);
  auVar8 = (undefined1  [56])0x0;
  SVar14 = SampledSpectrum::operator*(&local_38,a);
  auVar10._0_8_ = SVar14.values.values._8_8_;
  auVar10._8_56_ = auVar11;
  auVar7._0_8_ = SVar14.values.values._0_8_;
  auVar7._8_56_ = auVar8;
  auVar3 = vmovlhps_avx(auVar7._0_16_,auVar10._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar3;
  uVar1 = vmovlps_avx(auVar4._0_16_);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar12.super_Tuple3<pbrt::Point3,_float>.z;
  uVar1 = vmovlps_avx(auVar5._0_16_);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar2;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = 0.07957747;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample PointLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                   SampledWavelengths &lambda, Float time) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Ray ray(p, SampleUniformSphere(u1), time, mediumInterface.outside);
    return LightLeSample(scale * I.Sample(lambda), ray, 1, UniformSpherePDF());
}